

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.cpp
# Opt level: O0

ElementSegment * __thiscall
wasm::ModuleUtils::copyElementSegment::anon_class_16_2_e16996e4::operator()
          (anon_class_16_2_e16996e4 *this,
          unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *ret)

{
  bool bVar1;
  int iVar2;
  pointer pEVar3;
  size_type __n;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *this_00;
  reference ppEVar4;
  undefined4 extraout_var;
  ElementSegment *pEVar5;
  value_type local_40;
  Expression *local_38;
  Expression *item;
  const_iterator __end3;
  const_iterator __begin3;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *__range3;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *ret_local;
  anon_class_16_2_e16996e4 *this_local;
  
  pEVar5 = *this->segment;
  pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
           operator->(ret);
  wasm::Name::operator=((Name *)pEVar3,(Name *)pEVar5);
  bVar1 = ((*this->segment)->super_Named).hasExplicitName;
  pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
           operator->(ret);
  (pEVar3->super_Named).hasExplicitName = (bool)(bVar1 & 1);
  pEVar5 = *this->segment;
  pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
           operator->(ret);
  (pEVar3->type).id = (pEVar5->type).id;
  pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
           operator->(ret);
  __n = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                  (&(*this->segment)->data);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::reserve(&pEVar3->data,__n);
  this_00 = &(*this->segment)->data;
  __end3 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::begin(this_00);
  item = (Expression *)
         std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                *)&item);
    if (!bVar1) break;
    ppEVar4 = __gnu_cxx::
              __normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
              ::operator*(&__end3);
    local_38 = *ppEVar4;
    pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
             operator->(ret);
    iVar2 = ExpressionManipulator::copy((EVP_PKEY_CTX *)local_38,(EVP_PKEY_CTX *)this->out);
    local_40 = (value_type)CONCAT44(extraout_var,iVar2);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (&pEVar3->data,&local_40);
    __gnu_cxx::
    __normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
    ::operator++(&__end3);
  }
  pEVar5 = Module::addElementSegment(this->out,ret);
  return pEVar5;
}

Assistant:

ElementSegment* copyElementSegment(const ElementSegment* segment, Module& out) {
  auto copy = [&](std::unique_ptr<ElementSegment>&& ret) {
    ret->name = segment->name;
    ret->hasExplicitName = segment->hasExplicitName;
    ret->type = segment->type;
    ret->data.reserve(segment->data.size());
    for (auto* item : segment->data) {
      ret->data.push_back(ExpressionManipulator::copy(item, out));
    }

    return out.addElementSegment(std::move(ret));
  };

  if (segment->table.isNull()) {
    return copy(std::make_unique<ElementSegment>());
  } else {
    auto offset = ExpressionManipulator::copy(segment->offset, out);
    return copy(std::make_unique<ElementSegment>(segment->table, offset));
  }
}